

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBoundingBox.cpp
# Opt level: O0

void __thiscall ZXing::Pdf417::BoundingBox::calculateMinMaxValues(BoundingBox *this)

{
  bool bVar1;
  ResultPoint *pRVar2;
  float *pfVar3;
  ResultPoint *in_RDI;
  float y;
  float x;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  ResultPoint local_48;
  ResultPoint local_38;
  ResultPoint local_28;
  ResultPoint local_18;
  
  bVar1 = ZXing::operator==((Nullable<ZXing::ResultPoint> *)&(in_RDI->super_PointF).y,(nullptr_t)0x0
                           );
  if (bVar1) {
    pRVar2 = Nullable<ZXing::ResultPoint>::value
                       ((Nullable<ZXing::ResultPoint> *)&in_RDI[3].super_PointF.y);
    ResultPoint::y(pRVar2);
    ResultPoint::ResultPoint(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    Nullable<ZXing::ResultPoint>::operator=
              ((Nullable<ZXing::ResultPoint> *)&(in_RDI->super_PointF).y,&local_18);
    pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 5));
    ResultPoint::y(pRVar2);
    ResultPoint::ResultPoint(in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    Nullable<ZXing::ResultPoint>::operator=((Nullable<ZXing::ResultPoint> *)(in_RDI + 2),&local_28);
  }
  else {
    bVar1 = ZXing::operator==((Nullable<ZXing::ResultPoint> *)&in_RDI[3].super_PointF.y,
                              (nullptr_t)0x0);
    if (bVar1) {
      y = (float)(*(int *)&(in_RDI->super_PointF).x + -1);
      pRVar2 = Nullable<ZXing::ResultPoint>::value
                         ((Nullable<ZXing::ResultPoint> *)&(in_RDI->super_PointF).y);
      ResultPoint::y(pRVar2);
      ResultPoint::ResultPoint(in_RDI,in_stack_ffffffffffffff8c,y);
      Nullable<ZXing::ResultPoint>::operator=
                ((Nullable<ZXing::ResultPoint> *)&in_RDI[3].super_PointF.y,&local_38);
      x = (float)(*(int *)&(in_RDI->super_PointF).x + -1);
      pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 2));
      ResultPoint::y(pRVar2);
      ResultPoint::ResultPoint(in_RDI,x,y);
      Nullable<ZXing::ResultPoint>::operator=
                ((Nullable<ZXing::ResultPoint> *)(in_RDI + 5),&local_48);
    }
  }
  pRVar2 = Nullable<ZXing::ResultPoint>::value
                     ((Nullable<ZXing::ResultPoint> *)&(in_RDI->super_PointF).y);
  local_4c = ResultPoint::x(pRVar2);
  pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 2));
  local_50 = ResultPoint::x(pRVar2);
  pfVar3 = std::min<float>(&local_4c,&local_50);
  *(int *)&in_RDI[6].super_PointF.y = (int)*pfVar3;
  pRVar2 = Nullable<ZXing::ResultPoint>::value
                     ((Nullable<ZXing::ResultPoint> *)&in_RDI[3].super_PointF.y);
  local_54 = ResultPoint::x(pRVar2);
  pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 5));
  local_58 = ResultPoint::x(pRVar2);
  pfVar3 = std::max<float>(&local_54,&local_58);
  *(int *)((long)&in_RDI[6].super_PointF.y + 4) = (int)*pfVar3;
  pRVar2 = Nullable<ZXing::ResultPoint>::value
                     ((Nullable<ZXing::ResultPoint> *)&(in_RDI->super_PointF).y);
  local_5c = ResultPoint::y(pRVar2);
  pRVar2 = Nullable<ZXing::ResultPoint>::value
                     ((Nullable<ZXing::ResultPoint> *)&in_RDI[3].super_PointF.y);
  local_60 = ResultPoint::y(pRVar2);
  pfVar3 = std::min<float>(&local_5c,&local_60);
  *(int *)&in_RDI[7].super_PointF.x = (int)*pfVar3;
  pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 2));
  local_64 = ResultPoint::y(pRVar2);
  pRVar2 = Nullable<ZXing::ResultPoint>::value((Nullable<ZXing::ResultPoint> *)(in_RDI + 5));
  local_68 = ResultPoint::y(pRVar2);
  pfVar3 = std::max<float>(&local_64,&local_68);
  *(int *)((long)&in_RDI[7].super_PointF.x + 4) = (int)*pfVar3;
  return;
}

Assistant:

void
BoundingBox::calculateMinMaxValues()
{
	if (_topLeft == nullptr) {
		_topLeft = ResultPoint(0.f, _topRight.value().y());
		_bottomLeft = ResultPoint(0.f, _bottomRight.value().y());
	}
	else if (_topRight == nullptr) {
		_topRight = ResultPoint(static_cast<float>(_imgWidth - 1), _topLeft.value().y());
		_bottomRight = ResultPoint(static_cast<float>(_imgWidth - 1), _bottomLeft.value().y());
	}

	_minX = static_cast<int>(std::min(_topLeft.value().x(), _bottomLeft.value().x()));
	_maxX = static_cast<int>(std::max(_topRight.value().x(), _bottomRight.value().x()));
	_minY = static_cast<int>(std::min(_topLeft.value().y(), _topRight.value().y()));
	_maxY = static_cast<int>(std::max(_bottomLeft.value().y(), _bottomRight.value().y()));
}